

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * Curl_hash_add(Curl_hash *h,void *key,size_t key_len,void *p)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  Curl_llist *pCVar3;
  void *ne;
  long lVar4;
  Curl_llist_element *e;
  long lVar5;
  
  if (h->table == (Curl_llist *)0x0) {
    pCVar3 = (Curl_llist *)(*Curl_cmalloc)((long)h->slots << 5);
    h->table = pCVar3;
    if (pCVar3 == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
    if (0 < h->slots) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        Curl_llist_init((Curl_llist *)((long)&h->table->head + lVar4),hash_element_dtor);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar5 < h->slots);
    }
    if (pCVar3 == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
  }
  pCVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  pCVar3 = pCVar1 + sVar2;
  e = pCVar1[sVar2].head;
  do {
    if (e == (Curl_llist_element *)0x0) {
LAB_006334a9:
      ne = (*Curl_cmalloc)(key_len + 0x30);
      if (ne == (void *)0x0) {
        return (void *)0x0;
      }
      memcpy((void *)((long)ne + 0x28),key,key_len);
      *(size_t *)((long)ne + 0x20) = key_len;
      *(void **)((long)ne + 0x18) = p;
      Curl_llist_insert_next(pCVar3,pCVar3->tail,ne,(Curl_llist_element *)ne);
      h->size = h->size + 1;
      return p;
    }
    sVar2 = (*h->comp_func)((void *)((long)e->ptr + 0x28),*(size_t *)((long)e->ptr + 0x20),key,
                            key_len);
    if (sVar2 != 0) {
      Curl_llist_remove(pCVar3,e,h);
      h->size = h->size - 1;
      goto LAB_006334a9;
    }
    e = e->next;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct Curl_hash *h, void *key, size_t key_len, void *p)
{
  struct Curl_hash_element  *he;
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  if(!h->table) {
    int i;
    h->table = malloc(h->slots * sizeof(struct Curl_llist));
    if(!h->table)
      return NULL; /* OOM */
    for(i = 0; i < h->slots; ++i)
      Curl_llist_init(&h->table[i], hash_element_dtor);
  }

  l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct Curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    Curl_llist_insert_next(l, l->tail, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}